

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtInternalEdgeUtility.cpp
# Opt level: O2

void __thiscall
cbtConnectivityProcessor::processTriangle
          (cbtConnectivityProcessor *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [12];
  cbtTriangleInfo *pcVar8;
  cbtVector3 *pcVar9;
  int j;
  uint uVar10;
  long lVar11;
  int iVar12;
  cbtTriangleInfoMap *pcVar13;
  long lVar14;
  int i;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  cbtScalar cVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar43 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar68 [56];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  cbtVector3 cVar75;
  cbtVector3 cVar76;
  cbtScalar local_1ec;
  cbtVector3 normalB;
  int local_1d8 [4];
  undefined8 local_1c8;
  undefined4 local_1c0;
  cbtVector3 local_1b8;
  cbtVector3 local_1a8;
  cbtVector3 normalA;
  cbtVector3 edge;
  cbtQuaternion orn;
  cbtVector3 calculatedNormalA;
  cbtVector3 calculatedEdge;
  cbtTriangleShape tA;
  cbtTriangleShape tB;
  undefined1 extraout_var [60];
  ulong uVar67;
  
  auVar68 = in_ZMM1._8_56_;
  auVar43 = in_ZMM0._8_56_;
  if ((this->m_partIdA != partId) || (this->m_triangleIndexA != triangleIndex)) {
    local_1d8[2] = 0xffffffff;
    local_1d8[0] = -1;
    local_1d8[1] = -1;
    local_1c0 = 0xffffffff;
    local_1c8 = 0xffffffffffffffff;
    cVar75 = ::operator-(triangle + 1,triangle);
    auVar46._0_8_ = cVar75.m_floats._8_8_;
    auVar46._8_56_ = auVar68;
    auVar52._0_8_ = cVar75.m_floats._0_8_;
    auVar52._8_56_ = auVar43;
    tB.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._0_16_ = vmovlhps_avx(auVar52._0_16_,auVar46._0_16_);
    auVar43 = ZEXT856(tB.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                      super_cbtConvexShape.super_cbtCollisionShape._8_8_);
    cVar75 = ::operator-(triangle + 2,triangle);
    auVar47._0_8_ = cVar75.m_floats._8_8_;
    auVar47._8_56_ = auVar68;
    auVar23._0_8_ = cVar75.m_floats._0_8_;
    auVar23._8_56_ = auVar43;
    edge.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar23._0_16_,auVar47._0_16_);
    auVar43 = ZEXT856(edge.m_floats._8_8_);
    cVar75 = cbtVector3::cross((cbtVector3 *)&tB,&edge);
    auVar48._0_8_ = cVar75.m_floats._8_8_;
    auVar48._8_56_ = auVar68;
    auVar24._0_8_ = cVar75.m_floats._0_8_;
    auVar24._8_56_ = auVar43;
    tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._0_16_ = vmovlhps_avx(auVar24._0_16_,auVar48._0_16_);
    cVar18 = cbtVector3::length2((cbtVector3 *)&tA);
    auVar43 = (undefined1  [56])0x0;
    if (this->m_triangleInfoMap->m_equalVertexThreshold <= cVar18) {
      auVar68 = extraout_var_01;
      cVar75 = ::operator-(this->m_triangleVerticesA + 1,this->m_triangleVerticesA);
      auVar49._0_8_ = cVar75.m_floats._8_8_;
      auVar49._8_56_ = auVar43;
      auVar25._0_8_ = cVar75.m_floats._0_8_;
      auVar25._8_56_ = auVar68;
      tB.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
      super_cbtCollisionShape._0_16_ = vmovlhps_avx(auVar25._0_16_,auVar49._0_16_);
      auVar68 = ZEXT856(tB.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                        super_cbtConvexShape.super_cbtCollisionShape._8_8_);
      cVar75 = ::operator-(this->m_triangleVerticesA + 2,this->m_triangleVerticesA);
      auVar50._0_8_ = cVar75.m_floats._8_8_;
      auVar50._8_56_ = auVar43;
      auVar26._0_8_ = cVar75.m_floats._0_8_;
      auVar26._8_56_ = auVar68;
      edge.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar26._0_16_,auVar50._0_16_);
      auVar68 = ZEXT856(edge.m_floats._8_8_);
      cVar75 = cbtVector3::cross((cbtVector3 *)&tB,&edge);
      auVar51._0_8_ = cVar75.m_floats._8_8_;
      auVar51._8_56_ = auVar43;
      auVar27._0_8_ = cVar75.m_floats._0_8_;
      auVar27._8_56_ = auVar68;
      tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
      super_cbtCollisionShape._0_16_ = vmovlhps_avx(auVar27._0_16_,auVar51._0_16_);
      auVar28._0_4_ = cbtVector3::length2((cbtVector3 *)&tA);
      auVar28._4_60_ = extraout_var;
      pcVar13 = this->m_triangleInfoMap;
      auVar52 = ZEXT464((uint)pcVar13->m_equalVertexThreshold);
      if (pcVar13->m_equalVertexThreshold <= auVar28._0_4_) {
        lVar15 = 0;
        iVar12 = 0;
        while( true ) {
          auVar68 = auVar52._8_56_;
          auVar43 = auVar28._8_56_;
          if (lVar15 == 3) break;
          lVar11 = 0;
          pcVar9 = triangle;
          while( true ) {
            auVar68 = auVar52._8_56_;
            auVar43 = auVar28._8_56_;
            if (lVar11 == 3) break;
            cVar75 = ::operator-(this->m_triangleVerticesA + lVar15,pcVar9);
            auVar53._0_8_ = cVar75.m_floats._8_8_;
            auVar53._8_56_ = auVar68;
            auVar29._0_8_ = cVar75.m_floats._0_8_;
            auVar29._8_56_ = auVar43;
            tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
            super_cbtCollisionShape._0_16_ = vmovlhps_avx(auVar29._0_16_,auVar53._0_16_);
            auVar28._0_4_ = cbtVector3::length2((cbtVector3 *)&tA);
            auVar28._4_60_ = extraout_var_00;
            pcVar13 = this->m_triangleInfoMap;
            auVar52 = ZEXT464((uint)pcVar13->m_equalVertexThreshold);
            if (auVar28._0_4_ < pcVar13->m_equalVertexThreshold) {
              local_1d8[iVar12] = (int)lVar15;
              *(int *)((long)&local_1c8 + (long)iVar12 * 4) = (int)lVar11;
              if (1 < iVar12) {
                return;
              }
              iVar12 = iVar12 + 1;
            }
            lVar11 = lVar11 + 1;
            pcVar9 = pcVar9 + 1;
          }
          lVar15 = lVar15 + 1;
          if (2 < iVar12) {
            return;
          }
        }
        if (iVar12 == 2) {
          if ((local_1d8[0] == 0) && (local_1d8[1] == 2)) {
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_1c8;
            local_1d8[0] = 2;
            local_1d8[1] = 0;
            auVar19 = vshufps_avx(auVar19,auVar19,0xe1);
            auVar43 = ZEXT856(auVar19._8_8_);
            local_1c8 = vmovlps_avx(auVar19);
          }
          uVar10 = this->m_partIdA << 0x15 | this->m_triangleIndexA;
          tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
          super_cbtCollisionShape._vptr_cbtCollisionShape._0_4_ = uVar10;
          pcVar8 = cbtHashMap<cbtHashInt,_cbtTriangleInfo>::find
                             (&pcVar13->super_cbtInternalTriangleInfoMap,(cbtHashInt *)&tA);
          if (pcVar8 == (cbtTriangleInfo *)0x0) {
            auVar20._8_4_ = 0x40c90fdb;
            auVar20._0_8_ = 0x40c90fdb40c90fdb;
            auVar20._12_4_ = 0x40c90fdb;
            auVar43 = ZEXT856(auVar20._8_8_);
            uVar1 = vmovlps_avx(auVar20);
            auVar7._8_4_ = tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                           super_cbtConvexShape.super_cbtCollisionShape._12_4_;
            auVar7._0_8_ = uVar1;
            tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
            super_cbtCollisionShape._0_12_ = auVar7 << 0x20;
            tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
            super_cbtCollisionShape._12_4_ = 0x40c90fdb;
            auVar17._12_4_ = 0;
            auVar17._0_12_ =
                 (undefined1  [12])
                 tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape
                 .super_cbtCollisionShape._4_12_;
            tA.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
            super_cbtCollisionShape._0_16_ = auVar17 << 0x20;
            tB.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
            super_cbtCollisionShape._vptr_cbtCollisionShape._0_4_ = uVar10;
            cbtHashMap<cbtHashInt,_cbtTriangleInfo>::insert
                      (&this->m_triangleInfoMap->super_cbtInternalTriangleInfoMap,(cbtHashInt *)&tB,
                       (cbtTriangleInfo *)&tA);
            tB.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
            super_cbtCollisionShape._vptr_cbtCollisionShape._0_4_ = uVar10;
            pcVar8 = cbtHashMap<cbtHashInt,_cbtTriangleInfo>::find
                               (&this->m_triangleInfoMap->super_cbtInternalTriangleInfoMap,
                                (cbtHashInt *)&tB);
          }
          lVar14 = (long)local_1d8[0];
          lVar15 = (long)local_1d8[1];
          cVar75 = ::operator-(this->m_triangleVerticesA + lVar15,this->m_triangleVerticesA + lVar14
                              );
          auVar54._0_8_ = cVar75.m_floats._8_8_;
          auVar54._8_56_ = auVar68;
          auVar30._0_8_ = cVar75.m_floats._0_8_;
          auVar30._8_56_ = auVar43;
          edge.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar30._0_16_,auVar54._0_16_);
          auVar43 = ZEXT856(edge.m_floats._8_8_);
          pcVar9 = this->m_triangleVerticesA;
          cbtTriangleShape::cbtTriangleShape(&tA,pcVar9,pcVar9 + 1,pcVar9 + 2);
          lVar11 = (long)(int)local_1c8;
          iVar12 = local_1c8._4_4_ + (int)local_1c8;
          cbtTriangleShape::cbtTriangleShape
                    (&tB,triangle + local_1c8._4_4_,triangle + lVar11,triangle + (3 - iVar12));
          cbtTriangleShape::calcNormal(&tA,&normalA);
          cbtTriangleShape::calcNormal(&tB,&normalB);
          cbtVector3::normalize(&edge);
          cVar75 = cbtVector3::cross(&edge,&normalA);
          auVar55._0_8_ = cVar75.m_floats._8_8_;
          auVar55._8_56_ = auVar68;
          auVar31._0_8_ = cVar75.m_floats._0_8_;
          auVar31._8_56_ = auVar43;
          local_1b8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar31._0_16_,auVar55._0_16_);
          pcVar9 = cbtVector3::normalize(&local_1b8);
          lVar15 = lVar15 + lVar14;
          local_1a8.m_floats._0_8_ = *(undefined8 *)pcVar9->m_floats;
          local_1a8.m_floats._8_8_ = *(undefined8 *)(pcVar9->m_floats + 2);
          auVar43 = ZEXT856((ulong)local_1a8.m_floats._8_8_);
          cVar75 = ::operator-(this->m_triangleVerticesA + (3 - lVar15),
                               this->m_triangleVerticesA + lVar14);
          auVar56._0_8_ = cVar75.m_floats._8_8_;
          auVar56._8_56_ = auVar68;
          auVar32._0_8_ = cVar75.m_floats._0_8_;
          auVar32._8_56_ = auVar43;
          auVar69._8_8_ = 0;
          auVar69._0_4_ = local_1a8.m_floats[0];
          auVar69._4_4_ = local_1a8.m_floats[1];
          auVar73._0_4_ = cVar75.m_floats[0] * local_1a8.m_floats[0];
          auVar73._4_4_ = cVar75.m_floats[1] * local_1a8.m_floats[1];
          auVar73._8_4_ = auVar43._0_4_ * 0.0;
          auVar73._12_4_ = auVar43._4_4_ * 0.0;
          auVar19 = vmovshdup_avx(auVar73);
          auVar19 = vfmadd231ss_fma(auVar19,auVar69,auVar32._0_16_);
          auVar43 = (undefined1  [56])0x0;
          auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_1a8.m_floats[2]),auVar56._0_16_);
          uVar67 = 0;
          if (auVar19._0_4_ < 0.0) {
            auVar44._8_4_ = 0x80000000;
            auVar44._0_8_ = 0x8000000080000000;
            auVar44._12_4_ = 0x80000000;
            uVar67 = auVar44._8_8_;
            auVar70._0_8_ = local_1a8.m_floats._0_8_ ^ 0x8000000080000000;
            auVar70._8_4_ = 0x80000000;
            auVar70._12_4_ = 0x80000000;
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000000000000;
            auVar21._12_4_ = 0x80000000;
            auVar43 = ZEXT856(auVar21._8_8_);
            local_1a8.m_floats._0_8_ = vmovlps_avx(auVar70);
            local_1a8.m_floats._8_8_ = local_1a8.m_floats._8_8_ ^ 0x80000000;
          }
          auVar68 = ZEXT856(uVar67);
          cVar75 = cbtVector3::cross(&edge,&normalB);
          auVar57._0_8_ = cVar75.m_floats._8_8_;
          auVar57._8_56_ = auVar68;
          auVar33._0_8_ = cVar75.m_floats._0_8_;
          auVar33._8_56_ = auVar43;
          calculatedEdge.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar33._0_16_,auVar57._0_16_);
          pcVar9 = cbtVector3::normalize(&calculatedEdge);
          local_1b8.m_floats = *&pcVar9->m_floats;
          auVar43 = ZEXT856(*(ulong *)(pcVar9->m_floats + 2));
          cVar76 = ::operator-(triangle + (3 - iVar12),triangle + lVar11);
          cVar75.m_floats = local_1b8.m_floats;
          auVar58._0_8_ = cVar76.m_floats._8_8_;
          auVar58._8_56_ = auVar68;
          auVar34._0_8_ = cVar76.m_floats._0_8_;
          auVar34._8_56_ = auVar43;
          auVar71._8_8_ = 0;
          auVar71._0_4_ = local_1b8.m_floats[0];
          auVar71._4_4_ = local_1b8.m_floats[1];
          auVar74._0_4_ = cVar76.m_floats[0] * cVar75.m_floats[0];
          auVar74._4_4_ = cVar76.m_floats[1] * cVar75.m_floats[1];
          auVar74._8_4_ = auVar43._0_4_ * 0.0;
          auVar74._12_4_ = auVar43._4_4_ * 0.0;
          auVar19 = vmovshdup_avx(auVar74);
          auVar19 = vfmadd231ss_fma(auVar19,auVar71,auVar34._0_16_);
          local_1b8.m_floats[2] = cVar75.m_floats[2];
          auVar43 = (undefined1  [56])0x0;
          auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_1b8.m_floats[2]),auVar58._0_16_);
          uVar67 = 0;
          if (auVar19._0_4_ < 0.0) {
            auVar45._8_4_ = 0x80000000;
            auVar45._0_8_ = 0x8000000080000000;
            auVar45._12_4_ = 0x80000000;
            uVar67 = auVar45._8_8_;
            auVar72._0_8_ = local_1b8.m_floats._0_8_ ^ 0x8000000080000000;
            auVar72._8_4_ = 0x80000000;
            auVar72._12_4_ = 0x80000000;
            auVar22._0_4_ = -local_1b8.m_floats[2];
            auVar22._4_4_ = 0x80000000;
            auVar22._8_4_ = 0x80000000;
            auVar22._12_4_ = 0x80000000;
            auVar43 = ZEXT856(auVar22._8_8_);
            uVar1 = vmovlps_avx(auVar72);
            local_1b8.m_floats[3] = cVar75.m_floats[3];
            local_1b8.m_floats[2] = auVar22._0_4_;
            local_1b8.m_floats[0] = (cbtScalar)(int)uVar1;
            local_1b8.m_floats[1] = (cbtScalar)(int)((ulong)uVar1 >> 0x20);
            cVar75.m_floats = local_1b8.m_floats;
          }
          local_1b8.m_floats = cVar75.m_floats;
          auVar68 = ZEXT856(uVar67);
          cVar75 = cbtVector3::cross(&local_1a8,&local_1b8);
          auVar59._0_8_ = cVar75.m_floats._8_8_;
          auVar59._8_56_ = auVar68;
          auVar35._0_8_ = cVar75.m_floats._0_8_;
          auVar35._8_56_ = auVar43;
          calculatedEdge.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar35._0_16_,auVar59._0_16_);
          cVar18 = cbtVector3::length2(&calculatedEdge);
          auVar43 = (undefined1  [56])0x0;
          if (this->m_triangleInfoMap->m_planarEpsilon <= cVar18) {
            auVar68 = extraout_var_02;
            cbtVector3::normalize(&calculatedEdge);
            cVar75 = cbtVector3::cross(&calculatedEdge,&local_1a8);
            auVar60._0_8_ = cVar75.m_floats._8_8_;
            auVar60._8_56_ = auVar43;
            auVar36._0_8_ = cVar75.m_floats._0_8_;
            auVar36._8_56_ = auVar68;
            calculatedNormalA.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar36._0_16_,auVar60._0_16_)
            ;
            cbtVector3::normalize(&calculatedNormalA);
            cVar18 = cbtGetAngle(&calculatedNormalA,&local_1a8,&local_1b8);
            auVar43 = (undefined1  [56])0x0;
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(normalA.m_floats[1] * local_1b8.m_floats[1])),
                                      ZEXT416((uint)normalA.m_floats[0]),
                                      ZEXT416((uint)local_1b8.m_floats[0]));
            auVar19 = vfmadd132ss_fma(ZEXT416((uint)normalA.m_floats[2]),auVar19,
                                      ZEXT416((uint)local_1b8.m_floats[2]));
            auVar5._8_4_ = 0x80000000;
            auVar5._0_8_ = 0x8000000080000000;
            auVar5._12_4_ = 0x80000000;
            auVar17 = vxorps_avx512vl(ZEXT416((uint)(3.1415927 - cVar18)),auVar5);
            bVar6 = auVar19._0_4_ < 0.0;
            auVar16._4_12_ = auVar17._4_12_;
            auVar16._0_4_ = (uint)bVar6 * (int)(3.1415927 - cVar18) + (uint)!bVar6 * auVar17._0_4_;
          }
          else {
            auVar16._0_12_ = ZEXT812(0);
            auVar16._12_4_ = 0;
            bVar6 = false;
            auVar43 = extraout_var_02;
          }
          auVar68 = ZEXT856(auVar16._8_8_);
          iVar12 = (int)lVar15;
          if (iVar12 == 3) {
            cVar75 = ::operator-(this->m_triangleVerticesA + 1,this->m_triangleVerticesA + 2);
            auVar65._0_8_ = cVar75.m_floats._8_8_;
            auVar65._8_56_ = auVar68;
            auVar41._0_8_ = cVar75.m_floats._0_8_;
            auVar41._8_56_ = auVar43;
            calculatedNormalA.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar41._0_16_,auVar65._0_16_)
            ;
            auVar4._8_4_ = 0x80000000;
            auVar4._0_8_ = 0x8000000080000000;
            auVar4._12_4_ = 0x80000000;
            auVar17 = vxorps_avx512vl(auVar16,auVar4);
            auVar43 = ZEXT856(auVar17._8_8_);
            local_1ec = auVar17._0_4_;
            cbtQuaternion::setRotation(&orn,&calculatedNormalA,&local_1ec);
            cVar75 = quatRotate(&orn,&normalA);
            auVar66._0_8_ = cVar75.m_floats._8_8_;
            auVar66._8_56_ = auVar68;
            auVar42._0_8_ = cVar75.m_floats._0_8_;
            auVar42._8_56_ = auVar43;
            auVar19 = vmovshdup_avx(auVar42._0_16_);
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * normalB.m_floats[1])),
                                      auVar42._0_16_,ZEXT416((uint)normalB.m_floats[0]));
            auVar19 = vfmadd132ss_fma(auVar66._0_16_,auVar19,ZEXT416((uint)normalB.m_floats[2]));
            if (auVar19._0_4_ < 0.0) {
              *(byte *)&pcVar8->m_flags = (byte)pcVar8->m_flags | 0x10;
            }
            pcVar8->m_edgeV1V2Angle = auVar17._0_4_;
            if (bVar6) {
              *(byte *)&pcVar8->m_flags = (byte)pcVar8->m_flags | 2;
            }
          }
          else if (iVar12 == 2) {
            cVar75 = ::operator-(this->m_triangleVerticesA + 2,this->m_triangleVerticesA);
            auVar63._0_8_ = cVar75.m_floats._8_8_;
            auVar63._8_56_ = auVar68;
            auVar39._0_8_ = cVar75.m_floats._0_8_;
            auVar39._8_56_ = auVar43;
            calculatedNormalA.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar39._0_16_,auVar63._0_16_)
            ;
            auVar3._8_4_ = 0x80000000;
            auVar3._0_8_ = 0x8000000080000000;
            auVar3._12_4_ = 0x80000000;
            auVar17 = vxorps_avx512vl(auVar16,auVar3);
            auVar43 = ZEXT856(auVar17._8_8_);
            local_1ec = auVar17._0_4_;
            cbtQuaternion::setRotation(&orn,&calculatedNormalA,&local_1ec);
            cVar75 = quatRotate(&orn,&normalA);
            auVar64._0_8_ = cVar75.m_floats._8_8_;
            auVar64._8_56_ = auVar68;
            auVar40._0_8_ = cVar75.m_floats._0_8_;
            auVar40._8_56_ = auVar43;
            auVar19 = vmovshdup_avx(auVar40._0_16_);
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * normalB.m_floats[1])),
                                      auVar40._0_16_,ZEXT416((uint)normalB.m_floats[0]));
            auVar19 = vfmadd132ss_fma(auVar64._0_16_,auVar19,ZEXT416((uint)normalB.m_floats[2]));
            if (auVar19._0_4_ < 0.0) {
              *(byte *)&pcVar8->m_flags = (byte)pcVar8->m_flags | 0x20;
            }
            pcVar8->m_edgeV2V0Angle = auVar17._0_4_;
            if (bVar6) {
              *(byte *)&pcVar8->m_flags = (byte)pcVar8->m_flags | 4;
            }
          }
          else if (iVar12 == 1) {
            cVar75 = ::operator-(this->m_triangleVerticesA,this->m_triangleVerticesA + 1);
            auVar61._0_8_ = cVar75.m_floats._8_8_;
            auVar61._8_56_ = auVar68;
            auVar37._0_8_ = cVar75.m_floats._0_8_;
            auVar37._8_56_ = auVar43;
            calculatedNormalA.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar37._0_16_,auVar61._0_16_)
            ;
            auVar2._8_4_ = 0x80000000;
            auVar2._0_8_ = 0x8000000080000000;
            auVar2._12_4_ = 0x80000000;
            auVar17 = vxorps_avx512vl(auVar16,auVar2);
            auVar43 = ZEXT856(auVar17._8_8_);
            local_1ec = auVar17._0_4_;
            cbtQuaternion::setRotation(&orn,&calculatedNormalA,&local_1ec);
            cVar75 = quatRotate(&orn,&normalA);
            auVar62._0_8_ = cVar75.m_floats._8_8_;
            auVar62._8_56_ = auVar68;
            auVar38._0_8_ = cVar75.m_floats._0_8_;
            auVar38._8_56_ = auVar43;
            auVar19 = vmovshdup_avx(auVar38._0_16_);
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * normalB.m_floats[1])),
                                      auVar38._0_16_,ZEXT416((uint)normalB.m_floats[0]));
            auVar19 = vfmadd132ss_fma(auVar62._0_16_,auVar19,ZEXT416((uint)normalB.m_floats[2]));
            if (auVar19._0_4_ < 0.0) {
              *(byte *)&pcVar8->m_flags = (byte)pcVar8->m_flags | 8;
            }
            pcVar8->m_edgeV0V1Angle = auVar17._0_4_;
            if (bVar6) {
              *(byte *)&pcVar8->m_flags = (byte)pcVar8->m_flags | 1;
            }
          }
          cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape(&tB.super_cbtPolyhedralConvexShape);
          cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape(&tA.super_cbtPolyhedralConvexShape);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		//skip self-collisions
		if ((m_partIdA == partId) && (m_triangleIndexA == triangleIndex))
			return;

		//skip duplicates (disabled for now)
		//if ((m_partIdA <= partId) && (m_triangleIndexA <= triangleIndex))
		//	return;

		//search for shared vertices and edges
		int numshared = 0;
		int sharedVertsA[3] = {-1, -1, -1};
		int sharedVertsB[3] = {-1, -1, -1};

		///skip degenerate triangles
		cbtScalar crossBSqr = ((triangle[1] - triangle[0]).cross(triangle[2] - triangle[0])).length2();
		if (crossBSqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;

		cbtScalar crossASqr = ((m_triangleVerticesA[1] - m_triangleVerticesA[0]).cross(m_triangleVerticesA[2] - m_triangleVerticesA[0])).length2();
		///skip degenerate triangles
		if (crossASqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;

#if 0
		printf("triangle A[0]	=	(%f,%f,%f)\ntriangle A[1]	=	(%f,%f,%f)\ntriangle A[2]	=	(%f,%f,%f)\n",
			m_triangleVerticesA[0].getX(),m_triangleVerticesA[0].getY(),m_triangleVerticesA[0].getZ(),
			m_triangleVerticesA[1].getX(),m_triangleVerticesA[1].getY(),m_triangleVerticesA[1].getZ(),
			m_triangleVerticesA[2].getX(),m_triangleVerticesA[2].getY(),m_triangleVerticesA[2].getZ());

		printf("partId=%d, triangleIndex=%d\n",partId,triangleIndex);
		printf("triangle B[0]	=	(%f,%f,%f)\ntriangle B[1]	=	(%f,%f,%f)\ntriangle B[2]	=	(%f,%f,%f)\n",
			triangle[0].getX(),triangle[0].getY(),triangle[0].getZ(),
			triangle[1].getX(),triangle[1].getY(),triangle[1].getZ(),
			triangle[2].getX(),triangle[2].getY(),triangle[2].getZ());
#endif

		for (int i = 0; i < 3; i++)
		{
			for (int j = 0; j < 3; j++)
			{
				if ((m_triangleVerticesA[i] - triangle[j]).length2() < m_triangleInfoMap->m_equalVertexThreshold)
				{
					sharedVertsA[numshared] = i;
					sharedVertsB[numshared] = j;
					numshared++;
					///degenerate case
					if (numshared >= 3)
						return;
				}
			}
			///degenerate case
			if (numshared >= 3)
				return;
		}
		switch (numshared)
		{
			case 0:
			{
				break;
			}
			case 1:
			{
				//shared vertex
				break;
			}
			case 2:
			{
				//shared edge
				//we need to make sure the edge is in the order V2V0 and not V0V2 so that the signs are correct
				if (sharedVertsA[0] == 0 && sharedVertsA[1] == 2)
				{
					sharedVertsA[0] = 2;
					sharedVertsA[1] = 0;
					int tmp = sharedVertsB[1];
					sharedVertsB[1] = sharedVertsB[0];
					sharedVertsB[0] = tmp;
				}

				int hash = cbtGetHash(m_partIdA, m_triangleIndexA);

				cbtTriangleInfo* info = m_triangleInfoMap->find(hash);
				if (!info)
				{
					cbtTriangleInfo tmp;
					m_triangleInfoMap->insert(hash, tmp);
					info = m_triangleInfoMap->find(hash);
				}

				int sumvertsA = sharedVertsA[0] + sharedVertsA[1];
				int otherIndexA = 3 - sumvertsA;

				cbtVector3 edge(m_triangleVerticesA[sharedVertsA[1]] - m_triangleVerticesA[sharedVertsA[0]]);

				cbtTriangleShape tA(m_triangleVerticesA[0], m_triangleVerticesA[1], m_triangleVerticesA[2]);
				int otherIndexB = 3 - (sharedVertsB[0] + sharedVertsB[1]);

				cbtTriangleShape tB(triangle[sharedVertsB[1]], triangle[sharedVertsB[0]], triangle[otherIndexB]);
				//cbtTriangleShape tB(triangle[0],triangle[1],triangle[2]);

				cbtVector3 normalA;
				cbtVector3 normalB;
				tA.calcNormal(normalA);
				tB.calcNormal(normalB);
				edge.normalize();
				cbtVector3 edgeCrossA = edge.cross(normalA).normalize();

				{
					cbtVector3 tmp = m_triangleVerticesA[otherIndexA] - m_triangleVerticesA[sharedVertsA[0]];
					if (edgeCrossA.dot(tmp) < 0)
					{
						edgeCrossA *= -1;
					}
				}

				cbtVector3 edgeCrossB = edge.cross(normalB).normalize();

				{
					cbtVector3 tmp = triangle[otherIndexB] - triangle[sharedVertsB[0]];
					if (edgeCrossB.dot(tmp) < 0)
					{
						edgeCrossB *= -1;
					}
				}

				cbtScalar angle2 = 0;
				cbtScalar ang4 = 0.f;

				cbtVector3 calculatedEdge = edgeCrossA.cross(edgeCrossB);
				cbtScalar len2 = calculatedEdge.length2();

				cbtScalar correctedAngle(0);
				//cbtVector3 calculatedNormalB = normalA;
				bool isConvex = false;

				if (len2 < m_triangleInfoMap->m_planarEpsilon)
				{
					angle2 = 0.f;
					ang4 = 0.f;
				}
				else
				{
					calculatedEdge.normalize();
					cbtVector3 calculatedNormalA = calculatedEdge.cross(edgeCrossA);
					calculatedNormalA.normalize();
					angle2 = cbtGetAngle(calculatedNormalA, edgeCrossA, edgeCrossB);
					ang4 = SIMD_PI - angle2;
					cbtScalar dotA = normalA.dot(edgeCrossB);
					///@todo: check if we need some epsilon, due to floating point imprecision
					isConvex = (dotA < 0.);

					correctedAngle = isConvex ? ang4 : -ang4;
				}

				//alternatively use
				//cbtVector3 calculatedNormalB2 = quatRotate(orn,normalA);

				switch (sumvertsA)
				{
					case 1:
					{
						cbtVector3 edge = m_triangleVerticesA[0] - m_triangleVerticesA[1];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						cbtScalar bla = computedNormalB.dot(normalB);
						if (bla < 0)
						{
							computedNormalB *= -1;
							info->m_flags |= TRI_INFO_V0V1_SWAP_NORMALB;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE

						info->m_edgeV0V1Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V0V1_CONVEX;
						break;
					}
					case 2:
					{
						cbtVector3 edge = m_triangleVerticesA[2] - m_triangleVerticesA[0];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						if (computedNormalB.dot(normalB) < 0)
						{
							computedNormalB *= -1;
							info->m_flags |= TRI_INFO_V2V0_SWAP_NORMALB;
						}

#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE
						info->m_edgeV2V0Angle = -correctedAngle;
						if (isConvex)
							info->m_flags |= TRI_INFO_V2V0_CONVEX;
						break;
					}
					case 3:
					{
						cbtVector3 edge = m_triangleVerticesA[1] - m_triangleVerticesA[2];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						if (computedNormalB.dot(normalB) < 0)
						{
							info->m_flags |= TRI_INFO_V1V2_SWAP_NORMALB;
							computedNormalB *= -1;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE
						info->m_edgeV1V2Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V1V2_CONVEX;
						break;
					}
				}

				break;
			}
			default:
			{
				//				printf("warning: duplicate triangle\n");
			}
		}
	}